

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

Api RtAudio::getCompiledApiByName(string *name)

{
  Api AVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      return UNSPECIFIED;
    }
    AVar1 = rtaudio_compiled_apis[lVar3];
    bVar2 = std::operator==(name,rtaudio_api_names[AVar1][0]);
    lVar3 = lVar3 + 1;
  } while (!bVar2);
  return AVar1;
}

Assistant:

RtAudio::Api RtAudio :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtaudio_num_compiled_apis; ++i)
    if (name == rtaudio_api_names[rtaudio_compiled_apis[i]][0])
      return rtaudio_compiled_apis[i];
  return RtAudio::UNSPECIFIED;
}